

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# executor_function.hpp
# Opt level: O1

void __thiscall
asio::detail::executor_function::
executor_function<asio::detail::binder1<std::_Bind<void(*(std::shared_ptr<nuraft::delayed_task>,std::_Placeholder<1>))(std::shared_ptr<nuraft::delayed_task>&,std::error_code)>,std::error_code>,std::allocator<void>>
          (executor_function *this,
          binder1<std::_Bind<void_(*(std::shared_ptr<nuraft::delayed_task>,_std::_Placeholder<1>))(std::shared_ptr<nuraft::delayed_task>_&,_std::error_code)>,_std::error_code>
          *f,allocator<void> *a)

{
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *p_Var1;
  element_type *peVar2;
  error_category *peVar3;
  impl_base *piVar4;
  undefined8 uVar5;
  long *in_FS_OFFSET;
  ptr p;
  ptr local_28;
  
  if (*(long *)(*in_FS_OFFSET + -8) == 0) {
    uVar5 = 0;
  }
  else {
    uVar5 = *(undefined8 *)(*(long *)(*in_FS_OFFSET + -8) + 8);
  }
  local_28.a = a;
  piVar4 = (impl_base *)
           thread_info_base::allocate<asio::detail::thread_info_base::executor_function_tag>
                     (uVar5,0x38,8);
  local_28.p = (impl<asio::detail::binder1<std::_Bind<void_(*(std::shared_ptr<nuraft::delayed_task>,_std::_Placeholder<1>))(std::shared_ptr<nuraft::delayed_task>_&,_std::error_code)>,_std::error_code>,_std::allocator<void>_>
                *)0x0;
  peVar2 = (f->handler_)._M_bound_args.
           super__Tuple_impl<0UL,_std::shared_ptr<nuraft::delayed_task>,_std::_Placeholder<1>_>.
           super__Head_base<0UL,_std::shared_ptr<nuraft::delayed_task>,_false>._M_head_impl.
           super___shared_ptr<nuraft::delayed_task,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
  piVar4[1].complete_ = (_func_void_impl_base_ptr_bool *)(f->handler_)._M_f;
  piVar4[2].complete_ = (_func_void_impl_base_ptr_bool *)peVar2;
  piVar4[3].complete_ = (_func_void_impl_base_ptr_bool *)0x0;
  p_Var1 = (f->handler_)._M_bound_args.
           super__Tuple_impl<0UL,_std::shared_ptr<nuraft::delayed_task>,_std::_Placeholder<1>_>.
           super__Head_base<0UL,_std::shared_ptr<nuraft::delayed_task>,_false>._M_head_impl.
           super___shared_ptr<nuraft::delayed_task,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi;
  (f->handler_)._M_bound_args.
  super__Tuple_impl<0UL,_std::shared_ptr<nuraft::delayed_task>,_std::_Placeholder<1>_>.
  super__Head_base<0UL,_std::shared_ptr<nuraft::delayed_task>,_false>._M_head_impl.
  super___shared_ptr<nuraft::delayed_task,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  piVar4[3].complete_ = (_func_void_impl_base_ptr_bool *)p_Var1;
  (f->handler_)._M_bound_args.
  super__Tuple_impl<0UL,_std::shared_ptr<nuraft::delayed_task>,_std::_Placeholder<1>_>.
  super__Head_base<0UL,_std::shared_ptr<nuraft::delayed_task>,_false>._M_head_impl.
  super___shared_ptr<nuraft::delayed_task,_(__gnu_cxx::_Lock_policy)2>._M_ptr = (element_type *)0x0;
  peVar3 = (f->arg1_)._M_cat;
  piVar4[4].complete_ = *(_func_void_impl_base_ptr_bool **)&f->arg1_;
  piVar4[5].complete_ = (_func_void_impl_base_ptr_bool *)peVar3;
  piVar4->complete_ =
       complete<asio::detail::binder1<std::_Bind<void(*(std::shared_ptr<nuraft::delayed_task>,std::_Placeholder<1>))(std::shared_ptr<nuraft::delayed_task>&,std::error_code)>,std::error_code>,std::allocator<void>>
  ;
  this->impl_ = piVar4;
  local_28.v = (void *)0x0;
  impl<asio::detail::binder1<std::_Bind<void_(*(std::shared_ptr<nuraft::delayed_task>,_std::_Placeholder<1>))(std::shared_ptr<nuraft::delayed_task>_&,_std::error_code)>,_std::error_code>,_std::allocator<void>_>
  ::ptr::reset(&local_28);
  return;
}

Assistant:

explicit executor_function(F f, const Alloc& a)
  {
    // Allocate and construct an object to wrap the function.
    typedef impl<F, Alloc> impl_type;
    typename impl_type::ptr p = {
      detail::addressof(a), impl_type::ptr::allocate(a), 0 };
    impl_ = new (p.v) impl_type(ASIO_MOVE_CAST(F)(f), a);
    p.v = 0;
  }